

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_thread.cpp
# Opt level: O1

void __thiscall tst_thread::resolve_void(tst_thread *this)

{
  QSharedData *pQVar1;
  PromiseResolver<void> PVar2;
  PromiseDataBase<void,_void_()> *this_00;
  QThread *pQVar3;
  bool bVar4;
  char cVar5;
  PromiseDataBase<void,_void_()> *pPVar6;
  RunFunctionTaskBase<void> *this_01;
  QObject *pQVar7;
  char *pcVar8;
  char *pcVar9;
  QPromiseReject<void> *in_R8;
  QSharedData *pQVar10;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_c0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_b8;
  QPromise<void> local_b0;
  int value;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  PromiseDataBase<void,_void_()> *local_78;
  QSharedData *local_68;
  QThread *source;
  QThread *target;
  _Any_data local_50;
  code *local_40;
  
  value = -1;
  target = (QThread *)0x0;
  source = (QThread *)0x0;
  pPVar6 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar6->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar6->super_QSharedData = 0;
  *(undefined8 *)&pPVar6->m_lock = 0;
  *(undefined8 *)&pPVar6->m_settled = 0;
  (pPVar6->m_handlers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar6->m_handlers).d.size = 0;
  (pPVar6->m_catchers).d.d = (Data *)0x0;
  (pPVar6->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->m_catchers).d.size = 0;
  (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar6->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011baa0;
  QReadWriteLock::QReadWriteLock(&pPVar6->m_lock,0);
  pPVar6->m_settled = false;
  (pPVar6->m_handlers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar6->m_handlers).d.size = 0;
  (pPVar6->m_catchers).d.d = (Data *)0x0;
  (pPVar6->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->m_catchers).d.size = 0;
  (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar6->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ba28;
  LOCK();
  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_68 = &pPVar6->super_QSharedData;
  local_b0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b9f0;
  local_b0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pPVar6;
  local_78 = pPVar6;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_b0);
  local_b0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b8d8;
  if (&(local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar10 = &((local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar2.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_98._M_unused._0_8_ = (undefined8)QThreadPool::globalInstance();
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
  }
  local_98._8_8_ = (ulong)(uint)local_98._12_4_ << 0x20;
  this_01 = (RunFunctionTaskBase<void> *)operator_new(0x30);
  this_01->field_0x8 = 1;
  *(undefined ***)this_01 = &PTR_run_0011b988;
  QFutureInterfaceBase::QFutureInterfaceBase(&(this_01->promise).super_QFutureInterfaceBase,NoState)
  ;
  *(undefined ***)&this_01->promise = &PTR__QFutureInterfaceBase_0011b9b8;
  *(undefined ***)this_01 = &PTR_run_0011b828;
  *(QThread ***)(this_01 + 1) = &source;
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
   &this_01[1].field_0x8 = PVar2.m_d.d;
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
  }
  QtConcurrent::RunFunctionTaskBase<void>::start
            ((QFuture<void> *)&local_50,this_01,(TaskStartParameters *)&local_98);
  if (PVar2.m_d.d == (Data *)0x0) {
    QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)local_50._M_pod_data);
  }
  else {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
    QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)local_50._M_pod_data);
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  pPVar6 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar6->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar6->super_QSharedData = 0;
  (pPVar6->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->m_catchers).d.size = 0;
  (pPVar6->m_handlers).d.size = 0;
  (pPVar6->m_catchers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&pPVar6->m_lock = 0;
  *(undefined8 *)&pPVar6->m_settled = 0;
  (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar6->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011baa0;
  QReadWriteLock::QReadWriteLock(&pPVar6->m_lock,0);
  pPVar6->m_settled = false;
  (pPVar6->m_handlers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar6->m_handlers).d.size = 0;
  (pPVar6->m_catchers).d.d = (Data *)0x0;
  (pPVar6->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->m_catchers).d.size = 0;
  (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar6->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ba28;
  LOCK();
  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar10 = &pPVar6->super_QSharedData;
  LOCK();
  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b9f0;
  local_b0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pPVar6;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_b0);
  local_b0.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011b8d8;
  if (&(local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_b0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar2.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_c0 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_b8 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x20);
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
   local_98._M_unused._0_8_ = PVar2.m_d.d;
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
  }
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
   ((long)local_98._M_unused._0_8_ + 8) = PVar2.m_d.d;
  if (PVar2.m_d.d == (Data *)0x0) {
    *(QThread ***)((long)local_98._M_unused._0_8_ + 0x10) = &target;
    *(int **)((long)local_98._M_unused._0_8_ + 0x18) = &value;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
    *(QThread ***)((long)local_98._M_unused._0_8_ + 0x10) = &target;
    *(int **)((long)local_98._M_unused._0_8_ + 0x18) = &value;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  this_00 = local_78;
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (local_78,(function<void_()> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_c0,
             (QPromiseResolve<void> *)&local_b8,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_b8.d != (Data *)0x0) {
    LOCK();
    ((local_b8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_b8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_b8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_b8.d != (Data *)0x0)) {
      operator_delete(local_b8.d,0x10);
    }
  }
  if (local_c0.d != (Data *)0x0) {
    LOCK();
    ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_c0.d != (Data *)0x0)) {
      operator_delete(local_c0.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_00);
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar6);
  while (bVar4 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar6);
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar6->_vptr_PromiseDataBase[1])(pPVar6);
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar6->_vptr_PromiseDataBase[1])(pPVar6);
  }
  LOCK();
  (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  cVar5 = QTest::qVerify(source != (QThread *)0x0,"source != nullptr","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x48);
  if ((cVar5 != '\0') &&
     (cVar5 = QTest::qVerify(source != target,"source != target","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                             ,0x49), pQVar3 = target, cVar5 != '\0')) {
    pQVar7 = (QObject *)QThread::currentThread();
    pcVar8 = (char *)QTest::toString((QObject *)pQVar3);
    pcVar9 = (char *)QTest::toString(pQVar7);
    cVar5 = QTest::compare_helper
                      (pQVar3 == (QThread *)pQVar7,"Compared QObject pointers are not the same",
                       pcVar8,pcVar9,"target","QThread::currentThread()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                       ,0x4a);
    if (cVar5 != '\0') {
      QTest::qCompare(value,0x2b,"value","43",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                      ,0x4b);
    }
  }
  return;
}

Assistant:

void tst_thread::resolve_void()
{
    int value = -1;
    QThread* target = nullptr;
    QThread* source = nullptr;

    QtPromise::QPromise<void>{[&](const QtPromise::QPromiseResolve<void>& resolve) {
        std::ignore = QtConcurrent::run([=, &source]() {
            source = QThread::currentThread();
            resolve();
        });
    }}
        .then([&]() {
            target = QThread::currentThread();
            value = 43;
        })
        .wait();

    QVERIFY(source != nullptr);
    QVERIFY(source != target);
    QCOMPARE(target, QThread::currentThread());
    QCOMPARE(value, 43);
}